

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O3

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::ted_init
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  int iVar1;
  size_t sVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  PreLToSubtreeCost *pPVar6;
  size_t row;
  size_t col;
  double dVar7;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>).
  subproblem_counter_ = 0;
  iVar5 = (t1->super_Constants).tree_size_;
  iVar1 = (t2->super_Constants).tree_size_;
  if (iVar1 < iVar5) {
    iVar1 = iVar5;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->q_,(long)(iVar1 + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->fn_,(long)(iVar1 + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->ft_,(long)(iVar1 + 2));
  iVar5 = (t1->super_Constants).tree_size_;
  if (0 < iVar5) {
    uVar4 = (ulong)(uint)(t2->super_Constants).tree_size_;
    row = 0;
    do {
      if (0 < (int)uVar4) {
        iVar5 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[row];
        col = 0;
        do {
          iVar1 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>
                  ._M_impl.super__Vector_impl_data._M_start[col];
          if ((iVar5 == 1) && (dVar7 = 0.0, iVar1 == 1)) {
LAB_00119dc2:
            pdVar3 = data_structures::Matrix<double>::at(&this->delta_,row,col);
            *pdVar3 = dVar7;
          }
          else if ((iVar5 == 1) || (iVar1 == 1)) {
            pPVar6 = &t1->super_PreLToSubtreeCost;
            sVar2 = row;
            if (iVar5 == 1) {
              pPVar6 = (PreLToSubtreeCost *)&(t2->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_
              ;
              sVar2 = col;
            }
            dVar7 = (pPVar6->prel_to_subtree_del_cost_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar2] + -1.0;
            goto LAB_00119dc2;
          }
          col = col + 1;
          uVar4 = (ulong)(t2->super_Constants).tree_size_;
        } while ((long)col < (long)uVar4);
        iVar5 = (t1->super_Constants).tree_size_;
      }
      row = row + 1;
    } while ((long)row < (long)iVar5);
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::ted_init(const TreeIndex& t1, const TreeIndex& t2) {
  // Reset the subproblems counter.
  subproblem_counter_ = 0;
  // Initialize arrays.
  int max_size = std::max(t1.tree_size_, t2.tree_size_) + 1;
  // TODO: Move q initialisation to spfA.
  q_.resize(max_size);
  // TODO: Do not use fn and ft arrays [1, Section 8.4].
  fn_.resize(max_size + 1);
  ft_.resize(max_size + 1);
  // Compute subtree distances without the root nodes when one of subtrees
  // is a single node.
  int size_x = -1;
  int size_y = -1;
  // int parent_x = -1;
  // int parent_y = -1;
  // Loop over the nodes in reversed left-to-right preorder.
  for(int x = 0; x < t1.tree_size_; ++x) {
    size_x = t1.prel_to_size_[x];
    // parent_x = ni_1.preL_to_parent_[x];
    for(int y = 0; y < t2.tree_size_; ++y) {
      size_y = t2.prel_to_size_[y];
      // parent_y = ni_2.preL_to_parent_[y];
      // Set values in delta based on the sums of deletion and insertion
      // costs. Substract the costs for root nodes.
      // In this method we don't have to verify the order of the input trees
      // because it is equal to the original.
      if (size_x == 1 && size_y == 1) {
        delta_.at(x, y) = 0.0;
      } else if (size_x == 1) {
        delta_.at(x, y) = t2.prel_to_subtree_ins_cost_[y] - c_.ins(t2.prel_to_label_id_[y]);
      } else if (size_y == 1) {
        delta_.at(x, y) = t1.prel_to_subtree_del_cost_[x] - c_.del(t1.prel_to_label_id_[x]);
      }
    }
  }
}